

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_368fc4::RunCommand
               (string *command,string *output,int *retVal,char *dir,bool verbose,Encoding encoding)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  cmsysProcess *cp;
  byte bVar4;
  cmProcessOutput processOutput;
  int length;
  string *local_110;
  char *cmd [4];
  char *data;
  string commandInDir;
  string msg;
  string strdata;
  char *dir_local;
  string local_70;
  string local_50;
  
  bVar1 = cmSystemTools::s_DisableRunCommandOutput;
  local_110 = output;
  dir_local = dir;
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandInDir,"Error allocating process instance.",(allocator<char> *)cmd);
    cmSystemTools::Error(&commandInDir);
    goto LAB_001e23bb;
  }
  commandInDir._M_dataplus._M_p = (pointer)&commandInDir.field_2;
  commandInDir._M_string_length = 0;
  commandInDir.field_2._M_local_buf[0] = '\0';
  if (dir == (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&commandInDir);
  }
  else {
    cmStrCat<char_const(&)[5],char_const*&,char_const(&)[6],std::__cxx11::string&>
              ((string *)cmd,(char (*) [5])"cd \"",&dir_local,(char (*) [6])"\" && ",command);
    std::__cxx11::string::operator=((string *)&commandInDir,(string *)cmd);
    std::__cxx11::string::~string((string *)cmd);
  }
  std::__cxx11::string::append((char *)&commandInDir);
  std::__cxx11::string::_M_assign((string *)command);
  bVar4 = ~bVar1 & verbose;
  if (bVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)cmd,"running ",(allocator<char> *)&strdata);
    cmSystemTools::Stdout((string *)cmd);
    std::__cxx11::string::~string((string *)cmd);
    cmSystemTools::Stdout(command);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)cmd,"\n",(allocator<char> *)&strdata);
    cmSystemTools::Stdout((string *)cmd);
    std::__cxx11::string::~string((string *)cmd);
  }
  fflush(_stdout);
  fflush(_stderr);
  cmd[0] = "/bin/sh";
  cmd[1] = "-c";
  cmd[2] = (command->_M_dataplus)._M_p;
  cmd[3] = (char *)0x0;
  cmsysProcess_SetCommand(cp,cmd);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&processOutput,Auto,0x400);
  strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
  strdata._M_string_length = 0;
  strdata.field_2._M_local_buf[0] = '\0';
  while (uVar2 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), uVar2 != 0) {
    if ((uVar2 & 0xfffffffe) == 2) {
      if (bVar4 != 0) {
        cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,0);
        cmSystemTools::Stdout(&strdata);
      }
      std::__cxx11::string::append((char *)local_110,(ulong)data);
    }
  }
  if (bVar4 != 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,0);
    std::__cxx11::string::~string((string *)&local_50);
    if (strdata._M_string_length != 0) {
      cmSystemTools::Stdout(&strdata);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  std::__cxx11::string::string((string *)&local_70,(string *)local_110);
  cmProcessOutput::DecodeText(&processOutput,&local_70,local_110,0);
  std::__cxx11::string::~string((string *)&local_70);
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  iVar3 = cmsysProcess_GetState(cp);
  switch(iVar3) {
  case 1:
    *retVal = -1;
    std::__cxx11::string::append((char *)&msg);
    cmsysProcess_GetErrorString(cp);
    goto LAB_001e2364;
  case 2:
    *retVal = -1;
    std::__cxx11::string::append((char *)&msg);
    cmsysProcess_GetExceptionString(cp);
LAB_001e2364:
    std::__cxx11::string::append((char *)&msg);
    break;
  case 4:
    iVar3 = cmsysProcess_GetExitValue(cp);
    *retVal = iVar3;
    break;
  case 5:
    *retVal = -1;
    std::__cxx11::string::append((char *)&msg);
  }
  if (msg._M_string_length != 0) {
    std::__cxx11::string::append((string *)local_110);
  }
  cmsysProcess_Delete(cp);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&strdata);
LAB_001e23bb:
  std::__cxx11::string::~string((string *)&commandInDir);
  return cp != (cmsysProcess *)0x0;
}

Assistant:

bool RunCommand(std::string command, std::string& output, int& retVal,
                const char* dir, bool verbose, Encoding encoding)
{
  if (cmSystemTools::GetRunCommandOutput()) {
    verbose = false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  // if the command does not start with a quote, then
  // try to find the program, and if the program can not be
  // found use system to run the command as it must be a built in
  // shell command like echo or dir
  if (!command.empty() && command[0] == '\"') {
    // count the number of quotes
    int count = 0;
    for (char c : command) {
      if (c == '\"') {
        count++;
        if (count > 2) {
          break;
        }
      }
    }
    // if there are more than two double quotes use
    // GetShortPathName, the cmd.exe program in windows which
    // is used by system fails to execute if there are more than
    // one set of quotes in the arguments
    if (count > 2) {
      cmsys::RegularExpression quoted("^\"([^\"]*)\"[ \t](.*)");
      if (quoted.find(command)) {
        std::string shortCmd;
        std::string cmd = quoted.match(1);
        std::string args = quoted.match(2);
        if (!cmSystemTools::FileExists(cmd)) {
          shortCmd = cmd;
        } else if (!cmSystemTools::GetShortPath(cmd, shortCmd)) {
          cmSystemTools::Error("GetShortPath failed for " + cmd);
          return false;
        }
        shortCmd += " ";
        shortCmd += args;

        command = shortCmd;
      } else {
        cmSystemTools::Error("Could not parse command line with quotes " +
                             command);
      }
    }
  }
#endif

  // Allocate a process instance.
  cmsysProcess* cp = cmsysProcess_New();
  if (!cp) {
    cmSystemTools::Error("Error allocating process instance.");
    return false;
  }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (dir) {
    cmsysProcess_SetWorkingDirectory(cp, dir);
  }
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetOption(cp, cmsysProcess_Option_Verbatim, 1);
  const char* cmd[] = { command.c_str(), nullptr };
  cmsysProcess_SetCommand(cp, cmd);
#else
  std::string commandInDir;
  if (dir) {
    commandInDir = cmStrCat("cd \"", dir, "\" && ", command);
  } else {
    commandInDir = command;
  }
#  ifndef __VMS
  commandInDir += " 2>&1";
#  endif
  command = commandInDir;
  if (verbose) {
    cmSystemTools::Stdout("running ");
    cmSystemTools::Stdout(command);
    cmSystemTools::Stdout("\n");
  }
  fflush(stdout);
  fflush(stderr);
  const char* cmd[] = { "/bin/sh", "-c", command.c_str(), nullptr };
  cmsysProcess_SetCommand(cp, cmd);
#endif

  cmsysProcess_Execute(cp);

  // Read the process output.
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    if (p == cmsysProcess_Pipe_STDOUT || p == cmsysProcess_Pipe_STDERR) {
      if (verbose) {
        processOutput.DecodeText(data, length, strdata);
        cmSystemTools::Stdout(strdata);
      }
      output.append(data, length);
    }
  }

  if (verbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(output, output);

  // Check the result of running the process.
  std::string msg;
  switch (cmsysProcess_GetState(cp)) {
    case cmsysProcess_State_Exited:
      retVal = cmsysProcess_GetExitValue(cp);
      break;
    case cmsysProcess_State_Exception:
      retVal = -1;
      msg += "\nProcess terminated due to: ";
      msg += cmsysProcess_GetExceptionString(cp);
      break;
    case cmsysProcess_State_Error:
      retVal = -1;
      msg += "\nProcess failed because: ";
      msg += cmsysProcess_GetErrorString(cp);
      break;
    case cmsysProcess_State_Expired:
      retVal = -1;
      msg += "\nProcess terminated due to timeout.";
      break;
  }
  if (!msg.empty()) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    // Old Windows process execution printed this info.
    msg += "\n\nfor command: ";
    msg += command;
    if (dir) {
      msg += "\nin dir: ";
      msg += dir;
    }
    msg += "\n";
    if (verbose) {
      cmSystemTools::Stdout(msg);
    }
    output += msg;
#else
    // Old UNIX process execution only put message in output.
    output += msg;
#endif
  }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}